

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

void glfwGetMonitorPos(GLFWmonitor *handle,int *xpos,int *ypos)

{
  int *in_RDX;
  _GLFWmonitor *in_RSI;
  int *in_RDI;
  _GLFWmonitor *monitor;
  
  if (in_RSI != (_GLFWmonitor *)0x0) {
    in_RSI->name[0] = '\0';
    in_RSI->name[1] = '\0';
    in_RSI->name[2] = '\0';
    in_RSI->name[3] = '\0';
  }
  if (in_RDX != (int *)0x0) {
    *in_RDX = 0;
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    _glfwPlatformGetMonitorPos(in_RSI,in_RDX,in_RDI);
  }
  return;
}

Assistant:

GLFWAPI void glfwGetMonitorPos(GLFWmonitor* handle, int* xpos, int* ypos)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);

    if (xpos)
        *xpos = 0;
    if (ypos)
        *ypos = 0;

    _GLFW_REQUIRE_INIT();

    _glfwPlatformGetMonitorPos(monitor, xpos, ypos);
}